

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O0

int run_test_barrier_2(void)

{
  int iVar1;
  undefined1 local_40 [8];
  worker_config wc;
  uv_thread_t thread;
  
  memset(local_40,0,0x30);
  wc.barrier._24_4_ = 100;
  iVar1 = uv_barrier_init((uv_barrier_t *)local_40,2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-barrier.c"
            ,0x4b,"0 == uv_barrier_init(&wc.barrier, 2)");
    abort();
  }
  iVar1 = uv_thread_create((uv_thread_t *)&wc.main_barrier_wait_rval,worker,local_40);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-barrier.c"
            ,0x4c,"0 == uv_thread_create(&thread, worker, &wc)");
    abort();
  }
  wc.delay = uv_barrier_wait((uv_barrier_t *)local_40);
  iVar1 = uv_thread_join((uv_thread_t *)&wc.main_barrier_wait_rval);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-barrier.c"
            ,0x50,"0 == uv_thread_join(&thread)");
    abort();
  }
  uv_barrier_destroy((uv_barrier_t *)local_40);
  if ((wc.delay ^ wc.posted) != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-barrier.c"
            ,0x53,"1 == (wc.main_barrier_wait_rval ^ wc.worker_barrier_wait_rval)");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(barrier_2) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));
  wc.delay = 100;

  ASSERT(0 == uv_barrier_init(&wc.barrier, 2));
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  wc.main_barrier_wait_rval = uv_barrier_wait(&wc.barrier);

  ASSERT(0 == uv_thread_join(&thread));
  uv_barrier_destroy(&wc.barrier);

  ASSERT(1 == (wc.main_barrier_wait_rval ^ wc.worker_barrier_wait_rval));

  return 0;
}